

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O2

void __thiscall
ElectricityBill::ElectricityBill(ElectricityBill *this,EventLoop *loop,string *text_root)

{
  size_t *this_00;
  string *flat;
  LogLevel LVar1;
  long lVar2;
  Fmt local_4e8;
  undefined1 local_3e8 [8];
  FileForRead file_read;
  Timer timer;
  undefined1 local_f0 [8];
  RoomInfo room_info;
  string flatname;
  string roomname;
  allocator<char> local_31;
  
  this->loop_ = loop;
  std::__cxx11::string::string((string *)&this->text_root_,(string *)text_root);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &file_read.cache_buffer_.write_idx_,&this->text_root_,&ROOM_MAP_FILE_abi_cxx11_);
  higan::FileForAppend::FileForAppend
            (&this->room_file_,(string *)&file_read.cache_buffer_.write_idx_);
  std::__cxx11::string::~string((string *)&file_read.cache_buffer_.write_idx_);
  (this->room_informations_).super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->room_informations_).super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->room_informations_).super__Vector_base<RoomInfo,_std::allocator<RoomInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &file_read.cache_buffer_.write_idx_,text_root,&ROOM_MAP_FILE_abi_cxx11_);
  higan::FileForRead::FileForRead
            ((FileForRead *)local_3e8,(string *)&file_read.cache_buffer_.write_idx_);
  this_00 = &file_read.cache_buffer_.write_idx_;
  std::__cxx11::string::~string((string *)this_00);
  room_info.roomname.field_2._8_8_ = &flatname._M_string_length;
  flatname._M_dataplus._M_p = (pointer)0x0;
  flatname._M_string_length._0_1_ = 0;
  flatname.field_2._8_8_ = &roomname._M_string_length;
  roomname._M_dataplus._M_p = (pointer)0x0;
  roomname._M_string_length._0_1_ = 0;
  flat = (string *)(room_info.roomname.field_2._M_local_buf + 8);
  while( true ) {
    higan::FileForRead::ReadLine_abi_cxx11_((string *)this_00,(FileForRead *)local_3e8);
    lVar2 = std::__cxx11::string::operator=((string *)flat,(string *)this_00);
    lVar2 = *(long *)(lVar2 + 8);
    std::__cxx11::string::~string((string *)this_00);
    if (lVar2 == 0) break;
    higan::FileForRead::ReadLine_abi_cxx11_((string *)this_00,(FileForRead *)local_3e8);
    std::__cxx11::string::operator=((string *)(flatname.field_2._M_local_buf + 8),(string *)this_00)
    ;
    std::__cxx11::string::~string((string *)this_00);
    RoomInfo::RoomInfo((RoomInfo *)local_f0,flat,(string *)(flatname.field_2._M_local_buf + 8));
    std::vector<RoomInfo,_std::allocator<RoomInfo>_>::push_back
              (&this->room_informations_,(RoomInfo *)local_f0);
    LVar1 = higan::Logger::GetLogLevel();
    if ((int)LVar1 < 2) {
      higan::Logger::Logger
                ((Logger *)this_00,INFO,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/example/ElectricityBill/ElectricityBill.cpp"
                 ,0x21,"ElectricityBill");
      RoomInfo::GetRoomInfoString_abi_cxx11_
                ((string *)((long)&roomname.field_2 + 8),(RoomInfo *)local_f0);
      higan::Fmt::Fmt(&local_4e8,"read room: %s from file",roomname.field_2._8_8_);
      higan::Logger::operator<<((Logger *)this_00,&local_4e8);
      std::__cxx11::string::~string((string *)(roomname.field_2._M_local_buf + 8));
      higan::Logger::~Logger((Logger *)this_00);
    }
    RoomInfo::~RoomInfo((RoomInfo *)local_f0);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"QueryBill",&local_31);
  roomname.field_2._8_8_ = QueryBill;
  std::function<void(higan::Timer_const&)>::
  function<std::_Bind<void(ElectricityBill::*(ElectricityBill*,std::_Placeholder<1>))(higan::Timer_const&)>,void>
            ((function<void(higan::Timer_const&)> *)local_f0,
             (_Bind<void_(ElectricityBill::*(ElectricityBill_*,_std::_Placeholder<1>))(const_higan::Timer_&)>
              *)((long)&roomname.field_2 + 8));
  higan::Timer::Timer((Timer *)&file_read.cache_buffer_.write_idx_,(string *)&local_4e8,3600000,true
                      ,(TimerCallback *)local_f0);
  std::_Function_base::~_Function_base((_Function_base *)local_f0);
  std::__cxx11::string::~string((string *)&local_4e8);
  higan::EventLoop::AddTimer(this->loop_,(Timer *)&file_read.cache_buffer_.write_idx_);
  higan::Timer::~Timer((Timer *)&file_read.cache_buffer_.write_idx_);
  std::__cxx11::string::~string((string *)(flatname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(room_info.roomname.field_2._M_local_buf + 8));
  higan::FileForRead::~FileForRead((FileForRead *)local_3e8);
  return;
}

Assistant:

ElectricityBill::ElectricityBill(higan::EventLoop* loop, const std::string& text_root):
		loop_(loop),
		text_root_(text_root),
		room_file_(text_root_ + ROOM_MAP_FILE),
		room_informations_()
{
	higan::FileForRead file_read(text_root + ROOM_MAP_FILE);

	std::string flatname;
	std::string roomname;
	while (!(flatname = file_read.ReadLine()).empty())
	{
		roomname = file_read.ReadLine();

		RoomInfo room_info(flatname, roomname);
		room_informations_.push_back(room_info);

		LOG_INFO << higan::Fmt("read room: %s from file", room_info.GetRoomInfoString().c_str());
	}

	higan::Timer timer{"QueryBill", 60 * 60 * 1000, true,
					std::bind(&ElectricityBill::QueryBill, this, std::placeholders::_1)};
	loop_->AddTimer(timer);

}